

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O2

void __thiscall capnp::FlatMessageBuilder::requireFilled(FlatMessageBuilder *this)

{
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar1;
  Fault f;
  Fault local_10;
  
  AVar1 = MessageBuilder::getSegmentsForOutput(&this->super_MessageBuilder);
  if ((AVar1.ptr)->ptr + (AVar1.ptr)->size_ == (this->array).ptr + (this->array).size_) {
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
             ,0x11e,FAILED,"getSegmentsForOutput()[0].end() == array.end()",
             "\"FlatMessageBuilder\'s buffer was too large.\"",
             (char (*) [43])"FlatMessageBuilder\'s buffer was too large.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

void FlatMessageBuilder::requireFilled() {
  KJ_REQUIRE(getSegmentsForOutput()[0].end() == array.end(),
          "FlatMessageBuilder's buffer was too large.");
}